

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void __thiscall HTTPWorkItem::~HTTPWorkItem(HTTPWorkItem *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::_Function_base::~_Function_base(&(this->func).super__Function_base);
  std::__cxx11::string::~string((string *)&this->path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_>::~unique_ptr(&this->req);
    return;
  }
  __stack_chk_fail();
}

Assistant:

HTTPWorkItem(std::unique_ptr<HTTPRequest> _req, const std::string &_path, const HTTPRequestHandler& _func):
        req(std::move(_req)), path(_path), func(_func)
    {
    }